

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scomplex.c
# Opt level: O1

void c_div(singlecomplex *c,singlecomplex *a,singlecomplex *b)

{
  float fVar1;
  double __x;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar4 = b->r;
  fVar2 = b->i;
  fVar1 = -fVar4;
  if (-fVar4 <= fVar4) {
    fVar1 = fVar4;
  }
  fVar3 = -fVar2;
  if (-fVar2 <= fVar2) {
    fVar3 = fVar2;
  }
  if (fVar1 <= fVar3) {
    if ((fVar2 == 0.0) && (!NAN(fVar2))) {
      c_div_cold_1();
      fVar4 = c->r;
      fVar2 = c->i;
      fVar1 = -fVar4;
      if (-fVar4 <= fVar4) {
        fVar1 = fVar4;
      }
      fVar4 = -fVar2;
      if (-fVar2 <= fVar2) {
        fVar4 = fVar2;
      }
      fVar2 = fVar4;
      if (fVar4 <= fVar1) {
        fVar2 = fVar1;
      }
      if ((fVar1 + fVar4 != fVar2) || (NAN(fVar1 + fVar4) || NAN(fVar2))) {
        if (fVar4 <= fVar1) {
          fVar1 = fVar4;
        }
        __x = (double)((fVar1 / fVar2) * (fVar1 / fVar2)) + 1.0;
        if (__x < 0.0) {
          sqrt(__x);
        }
      }
      return;
    }
    fVar1 = fVar4 / fVar2;
    fVar4 = (fVar1 * fVar1 + 1.0) * fVar2;
    fVar2 = a->r;
    fVar3 = (fVar2 * fVar1 + a->i) / fVar4;
    fVar1 = fVar1 * a->i;
  }
  else {
    fVar2 = fVar2 / fVar4;
    fVar4 = (fVar2 * fVar2 + 1.0) * fVar4;
    fVar1 = a->i;
    fVar3 = (fVar1 * fVar2 + a->r) / fVar4;
    fVar2 = fVar2 * a->r;
  }
  c->r = fVar3;
  c->i = (fVar1 - fVar2) / fVar4;
  return;
}

Assistant:

void c_div(singlecomplex *c, const singlecomplex *a, const singlecomplex *b)
{
    float ratio, den;
    float abr, abi, cr, ci;
  
    if( (abr = b->r) < 0.)
	abr = - abr;
    if( (abi = b->i) < 0.)
	abi = - abi;
    if( abr <= abi ) {
	if (abi == 0) {
	    fprintf(stderr, "z_div.c: division by zero\n");
            exit(-1);
	}	  
	ratio = b->r / b->i ;
	den = b->i * (1 + ratio*ratio);
	cr = (a->r*ratio + a->i) / den;
	ci = (a->i*ratio - a->r) / den;
    } else {
	ratio = b->i / b->r ;
	den = b->r * (1 + ratio*ratio);
	cr = (a->r + a->i*ratio) / den;
	ci = (a->i - a->r*ratio) / den;
    }
    c->r = cr;
    c->i = ci;
}